

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

void __thiscall UCAFL::_afl_setup(UCAFL *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  uint8_t *puVar5;
  cmp_map *pcVar6;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  int cmplog_map_id;
  char *cmplog_map_id_str;
  int map_id;
  uint32_t r;
  char *inst_r_str;
  char *map_id_str;
  UCAFL *this_local;
  
  pcVar2 = getenv("__AFL_SHM_ID");
  pcVar3 = getenv("AFL_INST_RATIO");
  _setup_valid_wifsignaled(this);
  if (pcVar3 == (char *)0x0) {
    this->afl_inst_rms_ = 0x10000;
  }
  else {
    lVar4 = atol(pcVar3);
    cmplog_map_id_str._4_4_ = (uint)lVar4;
    if (cmplog_map_id_str._4_4_ < 0x65) {
      if (cmplog_map_id_str._4_4_ == 0) {
        cmplog_map_id_str._4_4_ = 1;
      }
    }
    else {
      cmplog_map_id_str._4_4_ = 100;
    }
    this->afl_inst_rms_ = (cmplog_map_id_str._4_4_ << 0x10) / 100;
  }
  if (pcVar2 == (char *)0x0) {
    puVar5 = (uint8_t *)mmap((void *)0x0,0x10000,3,0x22,-1,0);
    this->afl_area_ptr_ = puVar5;
    if (this->afl_area_ptr_ == (uint8_t *)0xffffffffffffffff) {
      perror("[!] mmap failed.");
      exit(0);
    }
    this->has_afl_ = false;
  }
  else {
    iVar1 = atoi(pcVar2);
    puVar5 = (uint8_t *)shmat(iVar1,(void *)0x0,0);
    this->afl_area_ptr_ = puVar5;
    if (this->afl_area_ptr_ == (uint8_t *)0xffffffffffffffff) {
      log(__x);
      exit(0);
    }
    this->has_afl_ = true;
    *this->afl_area_ptr_ = '\x01';
  }
  pcVar2 = getenv("__AFL_CMPLOG_SHM_ID");
  pcVar3 = getenv("UNICORN_AFL_CMPCOV");
  this->has_cmpcov_ = pcVar3 != (char *)0x0;
  if (pcVar2 == (char *)0x0) {
    this->has_cmplog_ = false;
  }
  else {
    if ((this->has_cmpcov_ & 1U) != 0) {
      __x_01 = log(__x_00);
      log(__x_01);
      this->has_cmpcov_ = false;
    }
    iVar1 = atoi(pcVar2);
    pcVar6 = (cmp_map *)shmat(iVar1,(void *)0x0,0);
    this->cmpmap_ = pcVar6;
    if (this->cmpmap_ == (cmp_map *)0xffffffffffffffff) {
      log(__x_02);
      exit(0);
    }
    this->has_cmplog_ = true;
  }
  return;
}

Assistant:

void _afl_setup() {
        char* map_id_str = getenv(SHM_ENV_VAR);
        char* inst_r_str = getenv("AFL_INST_RATIO");

        this->_setup_valid_wifsignaled();

        if (inst_r_str) {
            uint32_t r = atol(inst_r_str);

            if (r > 100) {
                r = 100;
            } else if (r == 0) {
                r = 1;
            }

            this->afl_inst_rms_ = MAP_SIZE * r / 100;
        } else {
            this->afl_inst_rms_ = MAP_SIZE;
        }

        if (likely(map_id_str)) {
            int map_id = atoi(map_id_str);

            this->afl_area_ptr_ = (uint8_t*)shmat(map_id, NULL, 0);

            if (this->afl_area_ptr_ == (void*)-1) {
                ERR("Can't get the afl mapping area.\n");
                exit(0);
            }

            this->has_afl_ = true;

            // Don't let our parent give up on us.
            this->afl_area_ptr_[0] = 1;
        } else {
            this->afl_area_ptr_ =
                (uint8_t*)mmap(NULL, MAP_SIZE, PROT_READ | PROT_WRITE,
                               MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);

            if (this->afl_area_ptr_ == MAP_FAILED) {
                perror("[!] mmap failed.");
                exit(0);
            }

            this->has_afl_ = false;
        }

        char* cmplog_map_id_str = getenv(CMPLOG_SHM_ENV_VAR);
        this->has_cmpcov_ = !!getenv("UNICORN_AFL_CMPCOV");

        if (cmplog_map_id_str) {
            if (this->has_cmpcov_) {
                ERR("CMPLOG and CMPCOV turned on at the same time!\n");
                ERR("I'll turn off CMPCOV.\n");
                this->has_cmpcov_ = false;
            }

            int cmplog_map_id = atoi(cmplog_map_id_str);
            this->cmpmap_ = (struct cmp_map*)shmat(cmplog_map_id, NULL, 0);

            if (this->cmpmap_ == (void*)-1) {
                ERR("Can't get the afl cmp-mapping area.\n");
                exit(0);
            }

            this->has_cmplog_ = true;
        } else {
            this->has_cmplog_ = false;
        }
    }